

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall mocker::ir::BasicBlock::isCompleted(BasicBlock *this)

{
  bool bVar1;
  shared_ptr<mocker::ir::IRInst> local_18;
  
  if ((this->insts).
      super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->insts) {
    bVar1 = false;
  }
  else {
    std::dynamic_pointer_cast<mocker::ir::Terminator,mocker::ir::IRInst>(&local_18);
    bVar1 = local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_18.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return bVar1;
}

Assistant:

bool BasicBlock::isCompleted() const {
  if (insts.empty())
    return false;
  return (bool)std::dynamic_pointer_cast<Terminator>(insts.back());
}